

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O0

void __thiscall S2Builder::Graph::VertexOutMap::VertexOutMap(VertexOutMap *this,Graph *g)

{
  Graph *g_local;
  VertexOutMap *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->edge_begins_);
  Init(this,g);
  return;
}

Assistant:

explicit VertexOutMap(const Graph& g) { Init(g); }